

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer,UseMemoization useMemoization)

{
  FieldDescriptor *field;
  int iVar1;
  long lVar2;
  Printer *this_00;
  bool bVar3;
  JavaType JVar4;
  Descriptor *pDVar5;
  char *pcVar6;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  Descriptor *descriptor;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  long lVar7;
  char *__end;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  string local_c8;
  allocator_type local_a4;
  equal_to<const_google::protobuf::Descriptor_*> local_a3;
  hash<const_google::protobuf::Descriptor_*> local_a2;
  _Identity<const_google::protobuf::Descriptor_*> local_a1;
  Printer *local_a0;
  undefined1 local_98 [48];
  string local_68;
  MessageGenerator *local_48;
  char *__end_1;
  char *local_38;
  
  local_a0 = printer;
  local_48 = this;
  if (useMemoization == MEMOIZE) {
    io::Printer::Print(printer,"private byte memoizedIsInitialized = -1;\n");
    io::Printer::Print(printer,"public final boolean isInitialized() {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "byte isInitialized = memoizedIsInitialized;\nif (isInitialized != -1) return isInitialized == 1;\n\n"
                      );
  }
  else {
    io::Printer::Print(printer,"public final boolean isInitialized() {\n");
    io::Printer::Indent(printer);
  }
  pDVar5 = local_48->descriptor_;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    pcVar10 = "";
    pcVar6 = "memoizedIsInitialized = 0;";
    if (useMemoization == MEMOIZE) {
      pcVar10 = "memoizedIsInitialized = 0;";
    }
    pcVar8 = pcVar10 + 0x1a;
    if (useMemoization != MEMOIZE) {
      pcVar8 = pcVar10;
    }
    lVar9 = 0;
    lVar7 = 0;
    do {
      if (*(int *)(*(long *)(pDVar5 + 0x30) + 0x30 + lVar9) == 2) {
        UnderscoresToCapitalizedCamelCase_abi_cxx11_
                  ((string *)local_98,(java *)(*(long *)(pDVar5 + 0x30) + lVar9),
                   (FieldDescriptor *)pcVar6);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar10,pcVar8);
        io::Printer::Print(local_a0,"if (!has$name$()) {\n  $memoize$\n  return false;\n}\n","name",
                           (string *)local_98,"memoize",&local_c8);
        pcVar6 = (char *)extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          pcVar6 = (char *)extraout_RDX_00;
        }
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          pcVar6 = (char *)extraout_RDX_01;
        }
      }
      lVar7 = lVar7 + 1;
      pDVar5 = local_48->descriptor_;
      lVar9 = lVar9 + 0x78;
    } while (lVar7 < *(int *)(pDVar5 + 0x2c));
  }
  pDVar5 = local_48->descriptor_;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    local_38 = "";
    if (useMemoization == MEMOIZE) {
      local_38 = "memoizedIsInitialized = 0;";
    }
    __end_1 = local_38 + 0x1a;
    if (useMemoization != MEMOIZE) {
      __end_1 = local_38;
    }
    lVar7 = 0;
    lVar9 = 0;
    do {
      lVar2 = *(long *)(pDVar5 + 0x30);
      field = (FieldDescriptor *)(lVar2 + lVar7);
      JVar4 = GetJavaType(field);
      if (JVar4 == JAVATYPE_MESSAGE) {
        pDVar5 = *(Descriptor **)(lVar2 + 0x48 + lVar7);
        std::tr1::
        _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
        ::_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                      *)local_98,10,&local_a2,(_Mod_range_hashing *)&local_c8,
                     (_Default_ranged_hash *)&local_68,&local_a3,&local_a1,&local_a4);
        bVar3 = anon_unknown_5::HasRequiredFields
                          (pDVar5,(hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
                                   *)local_98);
        std::tr1::
        _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
        ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                       *)local_98);
        if (bVar3) {
          iVar1 = *(int *)(lVar2 + 0x30 + lVar7);
          if (iVar1 == 1) {
            ClassName_abi_cxx11_((string *)local_98,*(java **)(lVar2 + 0x48 + lVar7),descriptor);
            UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_c8,(java *)field,field_02);
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_38,__end_1);
            io::Printer::Print(local_a0,
                               "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    $memoize$\n    return false;\n  }\n}\n"
                               ,"type",(string *)local_98,"name",&local_c8,"memoize",&local_68);
          }
          else if (iVar1 == 3) {
            ClassName_abi_cxx11_((string *)local_98,*(java **)(lVar2 + 0x48 + lVar7),descriptor);
            UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_c8,(java *)field,field_01);
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_38,__end_1);
            io::Printer::Print(local_a0,
                               "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    $memoize$\n    return false;\n  }\n}\n"
                               ,"type",(string *)local_98,"name",&local_c8,"memoize",&local_68);
          }
          else {
            if (iVar1 != 2) goto LAB_001a6e5d;
            ClassName_abi_cxx11_((string *)local_98,*(java **)(lVar2 + 0x48 + lVar7),descriptor);
            UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_c8,(java *)field,field_00);
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_38,__end_1);
            io::Printer::Print(local_a0,
                               "if (!get$name$().isInitialized()) {\n  $memoize$\n  return false;\n}\n"
                               ,"type",(string *)local_98,"name",&local_c8,"memoize",&local_68);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
        }
      }
LAB_001a6e5d:
      lVar9 = lVar9 + 1;
      pDVar5 = local_48->descriptor_;
      lVar7 = lVar7 + 0x78;
    } while (lVar9 < *(int *)(pDVar5 + 0x2c));
  }
  this_00 = local_a0;
  if (0 < *(int *)(pDVar5 + 0x58)) {
    pcVar6 = "";
    if (useMemoization == MEMOIZE) {
      pcVar6 = "memoizedIsInitialized = 0;";
    }
    pcVar10 = pcVar6 + 0x1a;
    if (useMemoization != MEMOIZE) {
      pcVar10 = pcVar6;
    }
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pcVar6,pcVar10);
    io::Printer::Print(this_00,
                       "if (!extensionsAreInitialized()) {\n  $memoize$\n  return false;\n}\n",
                       "memoize",(string *)local_98);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  io::Printer::Outdent(this_00);
  if (useMemoization == MEMOIZE) {
    io::Printer::Print(this_00,"  memoizedIsInitialized = 1;\n");
  }
  io::Printer::Print(this_00,"  return true;\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateIsInitialized(
    io::Printer* printer, UseMemoization useMemoization) {
  bool memoization = useMemoization == MEMOIZE;
  if (memoization) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). -1 means not yet computed. 0 means false and 1 means
    // true.
    printer->Print(
      "private byte memoizedIsInitialized = -1;\n");
  }
  printer->Print(
    "public final boolean isInitialized() {\n");
  printer->Indent();

  if (memoization) {
    printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized != -1) return isInitialized == 1;\n"
      "\n");
  }

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_required()) {
      printer->Print(
        "if (!has$name$()) {\n"
        "  $memoize$\n"
        "  return false;\n"
        "}\n",
        "name", UnderscoresToCapitalizedCamelCase(field),
        "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
            "if (!get$name$().isInitialized()) {\n"
             "  $memoize$\n"
             "  return false;\n"
             "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
            "if (has$name$()) {\n"
            "  if (!get$name$().isInitialized()) {\n"
            "    $memoize$\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
        case FieldDescriptor::LABEL_REPEATED:
          printer->Print(
            "for (int i = 0; i < get$name$Count(); i++) {\n"
            "  if (!get$name$(i).isInitialized()) {\n"
            "    $memoize$\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!extensionsAreInitialized()) {\n"
      "  $memoize$\n"
      "  return false;\n"
      "}\n",
      "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
  }

  printer->Outdent();

  if (memoization) {
    printer->Print(
      "  memoizedIsInitialized = 1;\n");
  }

  printer->Print(
    "  return true;\n"
    "}\n"
    "\n");
}